

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O0

void __thiscall CSHA1::Final(CSHA1 *this)

{
  uchar local_1c [8];
  uchar finalcount [8];
  uint i;
  CSHA1 *this_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 8; finalcount._0_4_ = finalcount._0_4_ + 1) {
    local_1c[(uint)finalcount._0_4_] =
         (uchar)(this->m_count[(int)(uint)((uint)finalcount._0_4_ < 4)] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  unique0x100001a8 = this;
  Update(this,(uchar *)anon_var_dwarf_a82f5,1);
  while ((this->m_count[0] & 0x1f8) != 0x1c0) {
    Update(this,(uchar *)"",1);
  }
  Update(this,local_1c,8);
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 0x14; finalcount._0_4_ = finalcount._0_4_ + 1) {
    this->m_digest[(uint)finalcount._0_4_] =
         (uchar)(this->m_state[(uint)finalcount._0_4_ >> 2] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  memset(this->m_buffer,0,0x40);
  memset(this,0,0x14);
  memset(this->m_count,0,8);
  memset(local_1c,0,8);
  Transform(this,this->m_state,this->m_buffer);
  return;
}

Assistant:

void CSHA1::Final()
{
	UINT_32 i;
	UINT_8 finalcount[8];

	for(i = 0; i < 8; i++)
		finalcount[i] = (UINT_8)((m_count[((i >= 4) ? 0 : 1)]
			>> ((3 - (i & 3)) * 8) ) & 255); // Endian independent

	Update((UINT_8 *)"\200", 1);

	while ((m_count[0] & 504) != 448)
		Update((UINT_8 *)"\0", 1);

	Update(finalcount, 8); // Cause a SHA1Transform()

	for(i = 0; i < 20; i++)
	{
		m_digest[i] = (UINT_8)((m_state[i >> 2] >> ((3 - (i & 3)) * 8) ) & 255);
	}

	// Wipe variables for security reasons
#ifdef SHA1_WIPE_VARIABLES
	i = 0;
	memset(m_buffer, 0, 64);
	memset(m_state, 0, 20);
	memset(m_count, 0, 8);
	memset(finalcount, 0, 8);
	Transform(m_state, m_buffer);
#endif
}